

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

void Omega_h::add_transition(FiniteAutomaton *fa,int from_state,int at_symbol,int to_state)

{
  int iVar1;
  Ref pvVar2;
  char *pcVar3;
  undefined8 uStack_30;
  
  if (to_state < 0) {
    pcVar3 = "0 <= to_state";
    uStack_30 = 0x34;
  }
  else {
    iVar1 = get_nrows<int>(&fa->table);
    if (to_state < iVar1) {
      if (at_symbol < 0) {
        pcVar3 = "0 <= at_symbol";
        uStack_30 = 0x36;
      }
      else if (at_symbol < (fa->table).ncols) {
        pvVar2 = at<int>(&fa->table,from_state,at_symbol);
        if (*pvVar2 == -1) {
          pvVar2 = at<int>(&fa->table,from_state,at_symbol);
          *pvVar2 = to_state;
          return;
        }
        pcVar3 = "at(fa.table, from_state, at_symbol) == -1";
        uStack_30 = 0x39;
      }
      else {
        pcVar3 = "at_symbol < get_ncols(fa.table)";
        uStack_30 = 0x38;
      }
    }
    else {
      pcVar3 = "to_state < get_nstates(fa)";
      uStack_30 = 0x35;
    }
  }
  fail("assertion %s failed at %s +%d\n",pcVar3,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
       ,uStack_30);
}

Assistant:

void add_transition(
    FiniteAutomaton& fa, int from_state, int at_symbol, int to_state) {
  OMEGA_H_CHECK(0 <= to_state);
  OMEGA_H_CHECK(to_state < get_nstates(fa));
  OMEGA_H_CHECK(0 <= at_symbol);
  OMEGA_H_CHECK(
      at_symbol < get_ncols(fa.table));  // allow setting epsilon transitions
  OMEGA_H_CHECK(at(fa.table, from_state, at_symbol) == -1);
  at(fa.table, from_state, at_symbol) = to_state;
}